

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cc
# Opt level: O0

size_t OB::String::damerau_levenshtein
                 (string *lhs,string *rhs,size_t weight_insert,size_t weight_substitute,
                 size_t weight_delete,size_t weight_transpose)

{
  allocator<unsigned_long> *this;
  char cVar1;
  unsigned_long uVar2;
  ulong uVar3;
  size_t sVar4;
  __type_conflict _Var5;
  bool bVar6;
  size_type sVar7;
  size_type sVar8;
  size_type sVar9;
  const_reference pvVar10;
  value_type vVar11;
  reference pvVar12;
  long lVar13;
  unsigned_long *puVar14;
  reference pvVar15;
  undefined1 auVar16 [16];
  unsigned_long local_178;
  unsigned_long local_170;
  unsigned_long local_168;
  unsigned_long local_160;
  ulong local_158;
  size_t j;
  size_t i_3;
  size_t i_2;
  value_type_conflict1 local_138;
  undefined1 local_130 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> v2;
  value_type_conflict1 local_110;
  undefined1 local_108 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> v1;
  allocator<unsigned_long> local_d9;
  value_type_conflict1 local_d8;
  undefined1 local_d0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> v0;
  ulong local_98;
  size_t i_1;
  ulong local_70;
  size_t i;
  undefined1 auStack_60 [7];
  bool swapped;
  string_view rhsv;
  string_view lhsv;
  size_t weight_transpose_local;
  size_t weight_delete_local;
  size_t weight_substitute_local;
  size_t weight_insert_local;
  string *rhs_local;
  string *lhs_local;
  
  _Var5 = std::operator==(lhs,rhs);
  if (_Var5) {
    lhs_local = (string *)0x0;
  }
  else {
    rhsv._M_str = (char *)std::__cxx11::string::operator_cast_to_basic_string_view((string *)lhs);
    auVar16 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)rhs);
    rhsv._M_len = auVar16._8_8_;
    _auStack_60 = auVar16._0_8_;
    sVar7 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&rhsv._M_str);
    sVar8 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)auStack_60);
    if (sVar8 < sVar7) {
      std::swap<std::basic_string_view<char,std::char_traits<char>>>
                ((basic_string_view<char,_std::char_traits<char>_> *)&rhsv._M_str,
                 (basic_string_view<char,_std::char_traits<char>_> *)auStack_60);
    }
    for (local_70 = 0;
        sVar9 = std::basic_string_view<char,_std::char_traits<char>_>::size
                          ((basic_string_view<char,_std::char_traits<char>_> *)&rhsv._M_str),
        local_70 < sVar9; local_70 = local_70 + 1) {
      pvVar10 = std::basic_string_view<char,_std::char_traits<char>_>::at
                          ((basic_string_view<char,_std::char_traits<char>_> *)&rhsv._M_str,local_70
                          );
      cVar1 = *pvVar10;
      pvVar10 = std::basic_string_view<char,_std::char_traits<char>_>::at
                          ((basic_string_view<char,_std::char_traits<char>_> *)auStack_60,local_70);
      if (cVar1 != *pvVar10) {
        if (local_70 != 0) {
          std::basic_string_view<char,_std::char_traits<char>_>::substr
                    ((basic_string_view<char,_std::char_traits<char>_> *)&rhsv._M_str,local_70,
                     0xffffffffffffffff);
          std::basic_string_view<char,_std::char_traits<char>_>::substr
                    ((basic_string_view<char,_std::char_traits<char>_> *)auStack_60,local_70,
                     0xffffffffffffffff);
        }
        break;
      }
    }
    for (local_98 = 0;
        sVar9 = std::basic_string_view<char,_std::char_traits<char>_>::size
                          ((basic_string_view<char,_std::char_traits<char>_> *)&rhsv._M_str),
        local_98 < sVar9; local_98 = local_98 + 1) {
      sVar9 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)&rhsv._M_str);
      pvVar10 = std::basic_string_view<char,_std::char_traits<char>_>::at
                          ((basic_string_view<char,_std::char_traits<char>_> *)&rhsv._M_str,
                           (sVar9 - 1) - local_98);
      cVar1 = *pvVar10;
      sVar9 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)auStack_60);
      pvVar10 = std::basic_string_view<char,_std::char_traits<char>_>::at
                          ((basic_string_view<char,_std::char_traits<char>_> *)auStack_60,
                           (sVar9 - 1) - local_98);
      if (cVar1 != *pvVar10) {
        if (local_98 != 0) {
          sVar9 = std::basic_string_view<char,_std::char_traits<char>_>::size
                            ((basic_string_view<char,_std::char_traits<char>_> *)&rhsv._M_str);
          std::basic_string_view<char,_std::char_traits<char>_>::substr
                    ((basic_string_view<char,_std::char_traits<char>_> *)&rhsv._M_str,0,
                     (sVar9 - 1) - local_98);
          sVar9 = std::basic_string_view<char,_std::char_traits<char>_>::size
                            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_60);
          join_0x00000010_0x00000000_ =
               std::basic_string_view<char,_std::char_traits<char>_>::substr
                         ((basic_string_view<char,_std::char_traits<char>_> *)auStack_60,0,
                          (sVar9 - 1) - local_98);
        }
        break;
      }
    }
    if (sVar8 < sVar7) {
      std::swap<std::basic_string_view<char,std::char_traits<char>>>
                ((basic_string_view<char,_std::char_traits<char>_> *)&rhsv._M_str,
                 (basic_string_view<char,_std::char_traits<char>_> *)auStack_60);
    }
    bVar6 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&rhsv._M_str);
    if (bVar6) {
      sVar7 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)auStack_60);
      lhs_local = (string *)(sVar7 * weight_insert);
    }
    else {
      bVar6 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)auStack_60);
      if (bVar6) {
        sVar7 = std::basic_string_view<char,_std::char_traits<char>_>::size
                          ((basic_string_view<char,_std::char_traits<char>_> *)&rhsv._M_str);
        lhs_local = (string *)(sVar7 * weight_delete);
      }
      else {
        sVar7 = std::basic_string_view<char,_std::char_traits<char>_>::size
                          ((basic_string_view<char,_std::char_traits<char>_> *)auStack_60);
        local_d8 = 0;
        std::allocator<unsigned_long>::allocator(&local_d9);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d0,sVar7 + 1,
                   &local_d8,&local_d9);
        std::allocator<unsigned_long>::~allocator(&local_d9);
        sVar7 = std::basic_string_view<char,_std::char_traits<char>_>::size
                          ((basic_string_view<char,_std::char_traits<char>_> *)auStack_60);
        local_110 = 0;
        this = (allocator<unsigned_long> *)
               ((long)&v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7);
        std::allocator<unsigned_long>::allocator(this);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_108,sVar7 + 1,
                   &local_110,this);
        std::allocator<unsigned_long>::~allocator
                  ((allocator<unsigned_long> *)
                   ((long)&v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        sVar7 = std::basic_string_view<char,_std::char_traits<char>_>::size
                          ((basic_string_view<char,_std::char_traits<char>_> *)auStack_60);
        local_138 = 0;
        std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&i_2 + 7));
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_130,sVar7 + 1,
                   &local_138,(allocator<unsigned_long> *)((long)&i_2 + 7));
        std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&i_2 + 7));
        for (i_3 = 0; sVar4 = i_3,
            sVar7 = std::basic_string_view<char,_std::char_traits<char>_>::size
                              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_60),
            sVar4 <= sVar7; i_3 = i_3 + 1) {
          vVar11 = i_3 * weight_insert;
          pvVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_108,
                               i_3);
          *pvVar12 = vVar11;
        }
        for (j = 0; sVar4 = j,
            sVar7 = std::basic_string_view<char,_std::char_traits<char>_>::size
                              ((basic_string_view<char,_std::char_traits<char>_> *)&rhsv._M_str),
            sVar4 < sVar7; j = j + 1) {
          lVar13 = j + 1;
          pvVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_130,0)
          ;
          *pvVar12 = lVar13 * weight_delete;
          for (local_158 = 0; uVar3 = local_158,
              sVar7 = std::basic_string_view<char,_std::char_traits<char>_>::size
                                ((basic_string_view<char,_std::char_traits<char>_> *)auStack_60),
              uVar3 < sVar7; local_158 = local_158 + 1) {
            pvVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_108,
                                 local_158 + 1);
            local_160 = *pvVar12 + weight_delete;
            pvVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_130,
                                 local_158);
            local_168 = *pvVar12 + weight_insert;
            pvVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_108,
                                 local_158);
            vVar11 = *pvVar12;
            pvVar10 = std::basic_string_view<char,_std::char_traits<char>_>::at
                                ((basic_string_view<char,_std::char_traits<char>_> *)&rhsv._M_str,j)
            ;
            cVar1 = *pvVar10;
            pvVar10 = std::basic_string_view<char,_std::char_traits<char>_>::at
                                ((basic_string_view<char,_std::char_traits<char>_> *)auStack_60,
                                 local_158);
            local_170 = vVar11 + weight_substitute * (cVar1 != *pvVar10);
            puVar14 = std::min<unsigned_long>(&local_168,&local_170);
            puVar14 = std::min<unsigned_long>(&local_160,puVar14);
            uVar2 = *puVar14;
            pvVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_130,
                                 local_158 + 1);
            *pvVar12 = uVar2;
            if ((j != 0) && (local_158 != 0)) {
              pvVar10 = std::basic_string_view<char,_std::char_traits<char>_>::at
                                  ((basic_string_view<char,_std::char_traits<char>_> *)&rhsv._M_str,
                                   j - 1);
              cVar1 = *pvVar10;
              pvVar10 = std::basic_string_view<char,_std::char_traits<char>_>::at
                                  ((basic_string_view<char,_std::char_traits<char>_> *)auStack_60,
                                   local_158);
              if (cVar1 == *pvVar10) {
                pvVar10 = std::basic_string_view<char,_std::char_traits<char>_>::at
                                    ((basic_string_view<char,_std::char_traits<char>_> *)
                                     &rhsv._M_str,j);
                cVar1 = *pvVar10;
                pvVar10 = std::basic_string_view<char,_std::char_traits<char>_>::at
                                    ((basic_string_view<char,_std::char_traits<char>_> *)auStack_60,
                                     local_158 - 1);
                if (cVar1 == *pvVar10) {
                  pvVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                       local_d0,local_158 + 1);
                  pvVar15 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                       local_d0,local_158 - 1);
                  local_178 = *pvVar15 + weight_transpose;
                  puVar14 = std::min<unsigned_long>(pvVar12,&local_178);
                  uVar2 = *puVar14;
                  pvVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                       local_130,local_158 + 1);
                  *pvVar12 = uVar2;
                }
              }
            }
          }
          std::swap<unsigned_long,std::allocator<unsigned_long>>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d0,
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_108);
          std::swap<unsigned_long,std::allocator<unsigned_long>>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_108,
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_130);
        }
        sVar7 = std::basic_string_view<char,_std::char_traits<char>_>::size
                          ((basic_string_view<char,_std::char_traits<char>_> *)auStack_60);
        pvVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_108,
                             sVar7);
        lhs_local = (string *)*pvVar12;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_130);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_108);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d0);
      }
    }
  }
  return (size_t)lhs_local;
}

Assistant:

std::size_t damerau_levenshtein(std::string const& lhs, std::string const& rhs,
  std::size_t const weight_insert, std::size_t const weight_substitute,
  std::size_t const weight_delete, std::size_t const weight_transpose)
{
  if (lhs == rhs)
  {
    return 0;
  }

  std::string_view lhsv {lhs};
  std::string_view rhsv {rhs};

  bool swapped {false};
  if (lhsv.size() > rhsv.size())
  {
    swapped = true;
    std::swap(lhsv, rhsv);
  }

  for (std::size_t i = 0; i < lhsv.size(); ++i)
  {
    if (lhsv.at(i) != rhsv.at(i))
    {
      if (i)
      {
        lhsv.substr(i);
        rhsv.substr(i);
      }

      break;
    }
  }

  for (std::size_t i = 0; i < lhsv.size(); ++i)
  {
    if (lhsv.at(lhsv.size() - 1 - i) != rhsv.at(rhsv.size() - 1 - i))
    {
      if (i)
      {
        lhsv.substr(0, lhsv.size() - 1 - i);
        rhsv.substr(0, rhsv.size() - 1 - i);
      }

      break;
    }
  }

  if (swapped)
  {
    std::swap(lhsv, rhsv);
  }

  if (lhsv.empty())
  {
    return rhsv.size() * weight_insert;
  }

  if (rhsv.empty())
  {
    return lhsv.size() * weight_delete;
  }

  std::vector<std::size_t> v0 (rhsv.size() + 1, 0);
  std::vector<std::size_t> v1 (rhsv.size() + 1, 0);
  std::vector<std::size_t> v2 (rhsv.size() + 1, 0);

  for (std::size_t i = 0; i <= rhsv.size(); ++i)
  {
    v1.at(i) = i * weight_insert;
  }

  for (std::size_t i = 0; i < lhsv.size(); ++i)
  {
    v2.at(0) = (i + 1) * weight_delete;
    for (std::size_t j = 0; j < rhsv.size(); j++)
    {
      v2.at(j + 1) = std::min(
        // deletion
        v1.at(j + 1) + weight_delete,
        std::min(
          // insertion
          v2.at(j) + weight_insert,
          // substitution
          v1.at(j) + (weight_substitute * (lhsv.at(i) != rhsv.at(j)))));

      if (i > 0 && j > 0 &&
        (lhsv.at(i - 1) == rhsv.at(j)) &&
        (lhsv.at(i) == rhsv.at(j - 1)))
      {
        v2.at(j + 1) = std::min(
          v0.at(j + 1),
          // transposition
          v0.at(j - 1) + weight_transpose);
      }
    }

    std::swap(v0, v1);
    std::swap(v1, v2);
  }

  return v1.at(rhsv.size());
}